

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O3

wchar_t output_code(archive_write_filter *f,wchar_t ocode)

{
  void *pvVar1;
  byte bVar2;
  wchar_t wVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  pvVar1 = f->data;
  iVar8 = *(int *)((long)pvVar1 + 0x6516c) % 8;
  bVar2 = (byte)(ocode << ((byte)iVar8 & 0x1f)) | *(byte *)((long)pvVar1 + 0x65170);
  *(byte *)((long)pvVar1 + 0x65170) = bVar2;
  output_byte(f,bVar2);
  iVar6 = *(int *)((long)pvVar1 + 0x18);
  iVar8 = 8 - iVar8;
  iVar7 = iVar6 - iVar8;
  iVar8 = ocode >> ((byte)iVar8 & 0x1f);
  if (7 < iVar7) {
    output_byte(f,(uchar)iVar8);
    iVar8 = iVar8 >> 8;
    iVar7 = iVar7 + -8;
    iVar6 = *(int *)((long)pvVar1 + 0x18);
  }
  iVar5 = *(int *)((long)pvVar1 + 0x6516c) + iVar6;
  *(int *)((long)pvVar1 + 0x6516c) = iVar5;
  bVar2 = (byte)iVar8 & ""[iVar7];
  *(byte *)((long)pvVar1 + 0x65170) = bVar2;
  if (iVar5 == iVar6 * 8) {
    *(undefined4 *)((long)pvVar1 + 0x6516c) = 0;
    iVar5 = 0;
  }
  if ((ocode == L'Ā') || (*(int *)((long)pvVar1 + 0x1c) < *(int *)((long)pvVar1 + 0x6515c))) {
    if (SBORROW4(iVar5,iVar6 * 8) != iVar5 + iVar6 * -8 < 0 && 0 < iVar5) {
      do {
        wVar3 = output_byte(f,bVar2);
        if (wVar3 != L'\0') {
          return wVar3;
        }
        iVar8 = *(int *)((long)pvVar1 + 0x6516c) + 8;
        *(int *)((long)pvVar1 + 0x6516c) = iVar8;
        *(undefined1 *)((long)pvVar1 + 0x65170) = 0;
        iVar6 = *(int *)((long)pvVar1 + 0x18);
        bVar2 = 0;
      } while (SBORROW4(iVar8,iVar6 * 8) != iVar8 + iVar6 * -8 < 0);
    }
    *(undefined1 *)((long)pvVar1 + 0x65170) = 0;
    *(undefined4 *)((long)pvVar1 + 0x6516c) = 0;
    if (ocode == L'Ā') {
      *(undefined8 *)((long)pvVar1 + 0x18) = 0x1ff00000009;
    }
    else {
      iVar6 = iVar6 + 1;
      *(int *)((long)pvVar1 + 0x18) = iVar6;
      if (iVar6 == 0x10) {
        uVar4 = *(uint *)((long)pvVar1 + 0x20);
      }
      else {
        uVar4 = ~(-1 << ((byte)iVar6 & 0x1f));
      }
      *(uint *)((long)pvVar1 + 0x1c) = uVar4;
    }
  }
  return L'\0';
}

Assistant:

static int
output_code(struct archive_write_filter *f, int ocode)
{
	struct private_data *state = f->data;
	int bits, ret, clear_flg, bit_offset;

	clear_flg = ocode == CLEAR;

	/*
	 * Since ocode is always >= 8 bits, only need to mask the first
	 * hunk on the left.
	 */
	bit_offset = state->bit_offset % 8;
	state->bit_buf |= (ocode << bit_offset) & 0xff;
	output_byte(f, state->bit_buf);

	bits = state->code_len - (8 - bit_offset);
	ocode >>= 8 - bit_offset;
	/* Get any 8 bit parts in the middle (<=1 for up to 16 bits). */
	if (bits >= 8) {
		output_byte(f, ocode & 0xff);
		ocode >>= 8;
		bits -= 8;
	}
	/* Last bits. */
	state->bit_offset += state->code_len;
	state->bit_buf = ocode & rmask[bits];
	if (state->bit_offset == state->code_len * 8)
		state->bit_offset = 0;

	/*
	 * If the next entry is going to be too big for the ocode size,
	 * then increase it, if possible.
	 */
	if (clear_flg || state->first_free > state->cur_maxcode) {
	       /*
		* Write the whole buffer, because the input side won't
		* discover the size increase until after it has read it.
		*/
		if (state->bit_offset > 0) {
			while (state->bit_offset < state->code_len * 8) {
				ret = output_byte(f, state->bit_buf);
				if (ret != ARCHIVE_OK)
					return ret;
				state->bit_offset += 8;
				state->bit_buf = 0;
			}
		}
		state->bit_buf = 0;
		state->bit_offset = 0;

		if (clear_flg) {
			state->code_len = 9;
			state->cur_maxcode = MAXCODE(state->code_len);
		} else {
			state->code_len++;
			if (state->code_len == 16)
				state->cur_maxcode = state->max_maxcode;
			else
				state->cur_maxcode = MAXCODE(state->code_len);
		}
	}

	return (ARCHIVE_OK);
}